

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O1

float __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::calculateLod
          (VertexCubeTextureCase *this,Vec2 *texScale,Vec2 *dstSize,int textureNdx)

{
  int i;
  long lVar1;
  float fVar2;
  Vec2 sizeRatio;
  Vector<float,_2> res;
  Vec2 srcSize;
  float local_18 [5];
  float local_4;
  
  local_18[4] = (float)(this->m_textures[textureNdx]->m_refTexture).m_size;
  local_4 = local_18[4];
  local_18[2] = 0.0;
  local_18[3] = 0.0;
  lVar1 = 0;
  do {
    local_18[lVar1 + 2] = texScale->m_data[lVar1] * local_18[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  lVar1 = 0;
  do {
    local_18[lVar1] = local_18[lVar1 + 2] / dstSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  fVar2 = logf((float)(~-(uint)(local_18[1] <= local_18[0]) & (uint)local_18[1] |
                      (uint)local_18[0] & -(uint)(local_18[1] <= local_18[0])));
  return fVar2 * 1.442695;
}

Assistant:

float VertexCubeTextureCase::calculateLod (const Vec2& texScale, const Vec2& dstSize, int textureNdx) const
{
	const tcu::TextureCube&		refTexture	= m_textures[textureNdx]->getRefTexture();
	const Vec2					srcSize		= Vec2((float)refTexture.getSize(), (float)refTexture.getSize());
	const Vec2					sizeRatio	= texScale*srcSize / dstSize;

	// \note In this particular case, dv/dx and du/dy are zero, simplifying the expression.
	return deFloatLog2(de::max(sizeRatio.x(), sizeRatio.y()));
}